

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

Action<void_(__locale_struct_*)> * __thiscall
testing::internal::TypedExpectation<void_(__locale_struct_*)>::GetCurrentAction
          (TypedExpectation<void_(__locale_struct_*)> *this,
          FunctionMockerBase<void_(__locale_struct_*)> *mocker,ArgumentTuple *args)

{
  int iVar1;
  FailureReporterInterface *pFVar2;
  size_t sVar3;
  ostream *poVar4;
  Action<void_(__locale_struct_*)> *pAVar5;
  int iVar6;
  char *pcVar7;
  stringstream ss;
  string local_1d8;
  ostream *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  iVar1 = (this->super_ExpectationBase).call_count_;
  local_1b8[0] = (ostream *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",""
            );
  if (iVar1 < 1) {
    pFVar2 = GetFailureReporter();
    (*pFVar2->_vptr_FailureReporterInterface[2])
              (pFVar2,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock/gmock.h"
               ,0x25fa,local_1b8);
  }
  if (local_1b8[0] != (ostream *)local_1a8) {
    operator_delete(local_1b8[0]);
  }
  iVar6 = (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                              super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_ExpectationBase).untyped_actions_.
                             super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
  if (((0 < iVar6) && (iVar6 < iVar1)) &&
     ((this->super_ExpectationBase).repeated_action_specified_ == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    ExpectationBase::DescribeLocationTo(&this->super_ExpectationBase,(ostream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Actions ran out in ",0x13);
    pcVar7 = (this->super_ExpectationBase).source_text_._M_dataplus._M_p;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(local_1a8[0] + -0x18) + (int)(ostream *)local_1a8);
    }
    else {
      sVar3 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Called ",7);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," times, but only ",0x11);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," WillOnce()",0xb);
    pcVar7 = "s are";
    if (iVar6 == 1) {
      pcVar7 = " is";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,(ulong)(iVar6 != 1) * 2 + 3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," specified - ",0xd);
    FunctionMockerBase<void_(__locale_struct_*)>::DescribeDefaultActionTo
              (mocker,args,(ostream *)local_1a8);
    std::__cxx11::stringbuf::str();
    Log(kWarning,&local_1d8,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (iVar6 < iVar1) {
    pAVar5 = &this->repeated_action_;
  }
  else {
    pAVar5 = (Action<void_(__locale_struct_*)> *)
             (this->super_ExpectationBase).untyped_actions_.
             super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar1 + -1];
  }
  return pAVar5;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count ?
        *static_cast<const Action<F>*>(untyped_actions_[count - 1]) :
        repeated_action();
  }